

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  uint32_t *puVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  byte bVar3;
  StorageClass SVar4;
  Variant *pVVar5;
  string *psVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  ExecutionModel EVar10;
  ExecutionModel EVar11;
  uint32_t uVar12;
  uint uVar13;
  SPIRVariable *pSVar14;
  SPIRType *pSVar15;
  SPIRConstant *pSVar16;
  ulong uVar17;
  Meta *pMVar18;
  SPIREntryPoint *pSVar19;
  SPIRExpression *pSVar20;
  mapped_type *pmVar21;
  mapped_type *this_01;
  runtime_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  undefined4 in_register_00000014;
  uint *insert_begin;
  ID IVar22;
  uint *itr;
  uint uVar23;
  __hashtable *__h;
  TypeID *pTVar24;
  ulong uVar25;
  uint32_t index;
  AccessChainMeta meta;
  string e;
  __node_gen_type __node_gen;
  SmallVector<unsigned_int,_8UL> indices;
  uint32_t local_12c;
  byte local_125;
  uint local_124;
  AccessChainMeta local_120;
  SPIRType *local_118;
  ulong local_110;
  ulong local_108;
  uint32_t local_100;
  uint32_t local_fc;
  SPIRVariable *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  uint32_t local_cc;
  string local_c8;
  SmallVector<unsigned_int,_8UL> local_a8;
  string local_70;
  string local_50;
  
  local_110 = CONCAT44(in_register_00000014,length);
  pSVar14 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  EVar10 = Compiler::get_execution_model((Compiler *)this);
  local_125 = (this->msl_options).multi_patch_workgroup;
  IVar22.id = ops[2];
  if (pSVar14 == (SPIRVariable *)0x0) {
    local_124 = 0;
    bVar8 = true;
    bVar9 = false;
  }
  else {
    bVar8 = Compiler::has_decoration((Compiler *)this,IVar22,DecorationPatch);
    bVar9 = true;
    if (!bVar8) {
      pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
      bVar9 = is_patch_block(this,pSVar15);
    }
    SVar4 = pSVar14->storage;
    uVar25 = (ulong)SVar4;
    if (SVar4 == StorageClassInput) {
      bVar8 = false;
    }
    else if (SVar4 == StorageClassOutput) {
      EVar11 = Compiler::get_execution_model((Compiler *)this);
      uVar25 = (ulong)EVar11;
      bVar8 = EVar11 != ExecutionModelTessellationControl;
    }
    else {
      bVar8 = true;
    }
    IVar22.id = ops[2];
    local_124 = (uint)CONCAT71((int7)(uVar25 >> 8),(pSVar14->super_IVariant).self.id != IVar22.id);
  }
  uVar12 = Compiler::get_decoration((Compiler *)this,IVar22,DecorationBuiltIn);
  if (((bVar8) || (pSVar14 == (SPIRVariable *)0x0)) || (bVar9 != false)) {
    if (pSVar14 == (SPIRVariable *)0x0) {
      IVar22.id = 0;
      goto LAB_00262442;
    }
LAB_00262234:
    IVar22.id = (pSVar14->super_IVariant).self.id;
LAB_00262442:
    pMVar18 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,IVar22);
    EVar10 = Compiler::get_execution_model((Compiler *)this);
    if (pSVar14 == (SPIRVariable *)0x0) {
      return false;
    }
    if (pMVar18 == (Meta *)0x0) {
      return false;
    }
    if (EVar10 != ExecutionModelTessellationControl) {
      return false;
    }
    if ((((pMVar18->decoration).builtin_type == BuiltInTessLevelInner) &&
        (pSVar19 = Compiler::get_entry_point((Compiler *)this),
        ((pSVar19->flags).lower & 0x400000) != 0)) &&
       ((uVar25 = (ulong)ops[3],
        (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
        buffer_size <= uVar25 ||
        ((pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar5[uVar25].type != TypeConstant
         || (pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar5 + uVar25),
            (pSVar16->m).c[0].r[0].u32 != 1)))))) {
      pSVar14 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                          ((Compiler *)this,ops[1],pSVar14);
      *(uint32_t *)&(pSVar14->super_IVariant).field_0xc = *ops;
      this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      local_a8.super_VectorView<unsigned_int>.ptr =
           (uint *)CONCAT44(local_a8.super_VectorView<unsigned_int>.ptr._4_4_,ops[2]);
      pmVar21 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&local_a8);
      local_f0._M_dataplus._M_p._0_4_ = ops[1];
      this_01 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&local_f0);
      Meta::operator=(this_01,pmVar21);
      Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[2]);
      return true;
    }
    return false;
  }
  bVar8 = Compiler::is_builtin_variable((Compiler *)this,pSVar14);
  if ((bVar8) && ((4 < uVar12 || (uVar12 == 2)))) {
    pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
    if (*(int *)&(pSVar15->super_IVariant).field_0xc != 0xf) goto LAB_00262234;
  }
  local_120.storage_physical_type = 0;
  local_120.need_transpose = false;
  local_120.storage_is_packed = false;
  local_120.storage_is_invariant = false;
  local_120.flattened_struct = false;
  local_a8.super_VectorView<unsigned_int>.ptr = (uint *)&local_a8.stack_storage;
  local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
  local_a8.buffer_capacity = 8;
  local_100 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  SmallVector<unsigned_int,_8UL>::reserve(&local_a8,(ulong)((int)local_110 - 2));
  uVar12 = this->next_metal_resource_ids[(ulong)(pSVar14->storage != StorageClassInput) + 0xc];
  if ((char)local_124 == '\0') {
    SmallVector<unsigned_int,_8UL>::reserve
              (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
    *(uint32_t *)
     ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
     local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = ops[3];
    local_a8.super_VectorView<unsigned_int>.buffer_size =
         local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
    local_fc = uVar12;
  }
  else {
    local_fc = ops[2];
  }
  local_118 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + *ops);
  local_12c = Compiler::get_extended_decoration
                        ((Compiler *)this,(pSVar14->super_IVariant).self.id,
                         SPIRVCrossDecorationInterfaceMemberIndex);
  local_108 = local_110 & 0xffffffff;
  local_f8 = pSVar14;
  local_cc = uVar12;
  if (pSVar14->storage == StorageClassInput) {
LAB_002622db:
    pSVar15 = Compiler::get_variable_element_type((Compiler *)this,pSVar14);
    uVar13 = local_124 & 0xff;
    uVar23 = -uVar13 + 4;
    uVar25 = (ulong)uVar23;
    if ((local_12c == 0xffffffff) && (uVar23 < (uint)local_110)) {
      uVar12 = (local_f8->super_IVariant).self.id;
      pSVar16 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar23]);
      local_12c = Compiler::get_extended_member_decoration
                            ((Compiler *)this,uVar12,(pSVar16->m).c[0].r[0].u32,
                             SPIRVCrossDecorationInterfaceMemberIndex);
      if (local_12c == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x17b2,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      pSVar16 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar23]);
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (pSVar15->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [(pSVar16->m).c[0].r[0].u32].id);
      uVar25 = (ulong)(-uVar13 + 5);
    }
    bVar3 = EVar10 == ExecutionModelTessellationControl & local_125;
    if ((uint)uVar25 < (uint)local_110) {
      bVar8 = true;
      do {
        if (((bVar3 != 0) ||
            ((bVar9 = Compiler::is_array((Compiler *)this,pSVar15), !bVar9 &&
             (bVar9 = Compiler::is_matrix((Compiler *)this,pSVar15), !bVar9)))) &&
           (uVar17 = uVar25, *(int *)&(pSVar15->super_IVariant).field_0xc != 0xf)) break;
        uVar17 = (ulong)ops[uVar25];
        if ((((this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.buffer_size <= uVar17) ||
            (pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr,
            pVVar5[uVar17].type != TypeConstant)) ||
           (pSVar16 = Variant::get<spirv_cross::SPIRConstant>(pVVar5 + uVar17),
           pSVar16->specialization == true)) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                     ,"");
          ::std::runtime_error::runtime_error(this_02,(string *)&local_f0);
          *(undefined ***)this_02 = &PTR__runtime_error_00357118;
          __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar13 = (pSVar16->m).c[0].r[0].u32;
        local_12c = local_12c + uVar13;
        uVar23 = (pSVar15->parent_type).id;
        if (uVar23 == 0) {
          if (*(int *)&(pSVar15->super_IVariant).field_0xc == 0xf) {
            uVar23 = (pSVar15->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar13].id;
            goto LAB_00262411;
          }
        }
        else {
LAB_00262411:
          pSVar15 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar23);
        }
        uVar25 = uVar25 + 1;
        bVar8 = uVar25 < local_108;
        uVar17 = local_108;
      } while (uVar25 != local_108);
    }
    else {
      bVar8 = false;
      uVar17 = uVar25;
    }
    if (bVar3 == 0) {
      bVar9 = Compiler::is_matrix((Compiler *)this,local_118);
      if ((!bVar9) &&
         (bVar9 = Compiler::is_array((Compiler *)this,local_118),
         !bVar9 && *(int *)&(local_118->super_IVariant).field_0xc != 0xf)) goto LAB_002624f5;
    }
    else if (*(int *)&(local_118->super_IVariant).field_0xc != 0xf) {
LAB_002624f5:
      local_f0._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
      uVar12 = local_100;
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,local_100,(uint *)&local_f0,&local_12c,(bool *)&local_c8);
      SmallVector<unsigned_int,_8UL>::reserve
                (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
      *(uint32_t *)
       ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
       local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar12;
      sVar7 = local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
      if (bVar8) {
        itr = (uint *)((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
                      local_a8.super_VectorView<unsigned_int>.buffer_size * 4 + 4);
        insert_begin = ops + (uVar17 & 0xffffffff);
        local_a8.super_VectorView<unsigned_int>.buffer_size =
             local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
        goto LAB_002625ef;
      }
      goto LAB_002625f4;
    }
    Compiler::set_extended_decoration
              ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,local_12c);
    sVar7 = local_a8.super_VectorView<unsigned_int>.buffer_size;
  }
  else {
    pSVar15 = Compiler::get_variable_element_type((Compiler *)this,pSVar14);
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(pSVar15->super_IVariant).self.id,DecorationBlock);
    if (bVar8) goto LAB_002622db;
    if (local_12c == 0xffffffff) {
      __assert_fail("index != uint32_t(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x17e3,
                    "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                   );
    }
    local_f0._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
    uVar12 = local_100;
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,local_100,(uint *)&local_f0,&local_12c,(bool *)&local_c8);
    SmallVector<unsigned_int,_8UL>::reserve
              (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
    puVar1 = (uint32_t *)
             ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
             local_a8.super_VectorView<unsigned_int>.buffer_size * 4);
    itr = puVar1 + 1;
    *puVar1 = uVar12;
    local_a8.super_VectorView<unsigned_int>.buffer_size =
         local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
    insert_begin = ops + 4;
LAB_002625ef:
    SmallVector<unsigned_int,_8UL>::insert(&local_a8,itr,insert_begin,ops + local_108);
    sVar7 = local_a8.super_VectorView<unsigned_int>.buffer_size;
  }
LAB_002625f4:
  local_a8.super_VectorView<unsigned_int>.buffer_size = sVar7;
  pSVar14 = local_f8;
  uVar12 = local_fc;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  if ((char)local_124 == '\0') {
    CompilerGLSL::access_chain_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_fc,
               local_a8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,local_118,&local_120,
               true);
    pSVar14 = local_f8;
  }
  else {
    uVar25 = (ulong)local_fc;
    if (((uVar25 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size) &&
        (pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.ptr, pVVar5[uVar25].type == TypeExpression)
        ) && (pSVar20 = Variant::get<spirv_cross::SPIRExpression>(pVVar5 + uVar25),
             (pSVar20->implied_read_expressions).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,uVar12,true);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_a8.super_VectorView<unsigned_int>.ptr;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_cc,
                 local_a8.super_VectorView<unsigned_int>.ptr,
                 (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,2,&local_120);
      join<std::__cxx11::string,std::__cxx11::string>
                (&local_c8,(spirv_cross *)&local_50,&local_70,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      psVar6 = &local_50;
      goto LAB_00262799;
    }
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,uVar12,
               local_a8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,0,&local_120);
  }
  ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_c8);
  psVar6 = &local_c8;
  local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
LAB_00262799:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &psVar6->field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar15 = Compiler::get_variable_data_type((Compiler *)this,pSVar14);
  bVar8 = Compiler::has_extended_decoration
                    ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar8) {
    uVar12 = Compiler::get_extended_decoration
                       ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar12);
  }
  if (3 < (uint)local_110) {
    uVar25 = 3;
    do {
      bVar8 = Compiler::is_array((Compiler *)this,pSVar15);
      if ((bVar8) || (*(int *)&(pSVar15->super_IVariant).field_0xc != 0xf)) {
        pTVar24 = &pSVar15->parent_type;
      }
      else {
        pSVar16 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + ops[uVar25]);
        pTVar24 = (pSVar15->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                  (pSVar16->m).c[0].r[0].u32;
      }
      pSVar15 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + pTVar24->id);
      uVar25 = uVar25 + 1;
    } while (local_108 != uVar25);
  }
  bVar8 = Compiler::is_array((Compiler *)this,pSVar15);
  if ((((!bVar8) && (bVar8 = Compiler::is_matrix((Compiler *)this,pSVar15), !bVar8)) &&
      (*(int *)&(pSVar15->super_IVariant).field_0xc != 0xf)) &&
     (local_118->vecsize < pSVar15->vecsize)) {
    CompilerGLSL::vector_swizzle(local_118->vecsize,0);
    ::std::__cxx11::string::append((char *)&local_f0);
  }
  uVar12 = ops[1];
  bVar8 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[2]);
  local_c8._M_dataplus._M_p._0_1_ = bVar8;
  pSVar20 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                      ((Compiler *)this,uVar12,&local_f0,ops,(bool *)&local_c8);
  puVar1 = ops + 1;
  (pSVar20->loaded_from).id = (local_f8->super_IVariant).self.id;
  pSVar20->need_transpose = local_120.need_transpose;
  pSVar20->access_chain = true;
  if (local_120.storage_is_packed == true) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (local_120.storage_physical_type != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypeID,
               local_120.storage_physical_type);
  }
  if (local_120.storage_is_invariant == true) {
    Compiler::set_decoration((Compiler *)this,(ID)*puVar1,DecorationInvariant,0);
  }
  Compiler::set_extended_decoration
            ((Compiler *)this,*puVar1,SPIRVCrossDecorationTessIOOriginalInputTypeID,
             (pSVar15->super_IVariant).self.id);
  puVar2 = &(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
  local_c8._M_dataplus._M_p = (pointer)puVar2;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)puVar2,puVar1);
  local_c8._M_dataplus._M_p =
       (pointer)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_c8._M_dataplus._M_p,puVar1);
  if (2 < (uint)local_110) {
    uVar25 = 2;
    do {
      Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[uVar25]);
      Compiler::add_implied_read_expression((Compiler *)this,pSVar20,ops[uVar25]);
      uVar25 = uVar25 + 1;
    } while (local_108 != uVar25);
  }
  if ((pSVar20->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&puVar2->_M_h,puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_a8.super_VectorView<unsigned_int>.ptr !=
      &local_a8.stack_storage) {
    free(local_a8.super_VectorView<unsigned_int>.ptr);
  }
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool multi_patch = get_execution_model() == ExecutionModelTessellationControl && msl_options.multi_patch_workgroup;

	if (var)
	{
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(get_variable_data_type(*var));

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput ||
		            (var->storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationControl);

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	BuiltIn bi_type = BuiltIn(get_decoration(ops[2], DecorationBuiltIn));
	if (var && flat_data && !patch &&
	    (!is_builtin_variable(*var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
	     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
	     get_variable_data_type(*var).basetype == SPIRType::Struct))
	{
		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = ptr_is_chain ? 3 : 4;
		VariableID stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;
		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[3]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(var->self, SPIRVCrossDecorationInterfaceMemberIndex);
		if (var->storage == StorageClassInput || has_decoration(get_variable_element_type(*var).self, DecorationBlock))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				index = get_extended_member_decoration(var->self, get_constant(ops[first_non_array_index]).scalar(),
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[get_constant(ops[first_non_array_index]).scalar()]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; i < length; ++i)
			{
				if ((multi_patch || (!is_array(*type) && !is_matrix(*type))) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			if ((!multi_patch && (is_matrix(result_ptr_type) || is_array(result_ptr_type))) ||
			    result_ptr_type.basetype == SPIRType::Struct)
			{
				// We're not going to emit the actual member name, we let any further OpLoad take care of that.
				// Tag the access chain with the member index we're referencing.
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			}
			else
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
		}
		else
		{
			assert(index != uint32_t(-1));
			set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
			indices.push_back(const_mbr_id);

			indices.insert(indices.end(), ops + 4, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, true);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			if (ptr_expr && ptr_expr->implied_read_expressions.size() == 2)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (get_execution_model() == ExecutionModelTessellationControl && var && m &&
	    m->decoration.builtin_type == BuiltInTessLevelInner && get_entry_point().flags.get(ExecutionModeTriangles))
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}